

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

int ppc6xx_tlb_getnum(CPUPPCState_conflict2 *env,target_ulong eaddr,int way,int is_code)

{
  int local_24;
  int nr;
  int is_code_local;
  int way_local;
  target_ulong eaddr_local;
  CPUPPCState_conflict2 *env_local;
  
  local_24 = env->tlb_per_way * way + ((uint)(eaddr >> 0xc) & env->tlb_per_way - 1U);
  if ((is_code != 0) && (env->id_tlbs == 1)) {
    local_24 = env->nb_tlb + local_24;
  }
  return local_24;
}

Assistant:

static inline int ppc6xx_tlb_getnum(CPUPPCState *env, target_ulong eaddr,
                                    int way, int is_code)
{
    int nr;

    /* Select TLB num in a way from address */
    nr = (eaddr >> TARGET_PAGE_BITS) & (env->tlb_per_way - 1);
    /* Select TLB way */
    nr += env->tlb_per_way * way;
    /* 6xx have separate TLBs for instructions and data */
    if (is_code && env->id_tlbs == 1) {
        nr += env->nb_tlb;
    }

    return nr;
}